

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msd.c
# Opt level: O2

void ontostack(bucket_conflict1 *b,int pos)

{
  list *tail;
  stack *psVar1;
  list plVar2;
  int size;
  
  plVar2 = b->tail;
  plVar2->next = (list)0x0;
  size = b->size;
  if (size < 0x15) {
    tail = &b->tail;
    if (1 < size) {
      plVar2 = ListInsertsort(b->head,tail,pos);
      b->head = plVar2;
    }
    b->size = 0;
    psVar1 = stackp;
    if (stackp == (stack *)0x0) {
      plVar2 = *tail;
      size = 0;
    }
    else {
      size = 0;
      plVar2 = *tail;
      if (stackp->size == 0) {
        stackp->tail->next = b->head;
        psVar1->tail = plVar2;
        goto LAB_0022344a;
      }
    }
  }
  push(b->head,plVar2,size,pos);
  b->size = 0;
LAB_0022344a:
  b->head = (list)0x0;
  return;
}

Assistant:

static void ontostack(bucket *b, int pos)
{
   b->tail->next = NULL;
   if (b->size <= INSERTBREAK) {
      if (b->size > 1)
         b->head = ListInsertsort(b->head, &b->tail, pos);
      b->size = 0;   /* sorted */
   }
   if (!b->size && !stackempty() && !top()->size) {
      top()->tail->next = b->head;
      top()->tail = b->tail;
   }
   else {
      push(b->head, b->tail, b->size, pos);
      b->size = 0;
   }
   b->head = NULL;
}